

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O0

int CVmObjList::getp_remove_range(vm_val_t *retval,vm_val_t *self_val,char *lst,uint *argc)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  undefined8 in_RCX;
  char *in_RDX;
  vm_val_t *in_RSI;
  vm_val_t *in_RDI;
  int end_idx;
  int start_idx;
  CVmNativeCodeDesc *in_stack_ffffffffffffffa8;
  uint *in_stack_ffffffffffffffb0;
  vm_val_t *in_stack_ffffffffffffffb8;
  int local_3c;
  int local_38;
  
  if ((getp_remove_range(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_remove_range(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)
                                   ::desc), iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_remove_range::desc,2);
    __cxa_guard_release(&getp_remove_range(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::
                         desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (iVar1 != 0) {
    return 1;
  }
  local_38 = CVmBif::pop_int_val();
  local_3c = CVmBif::pop_int_val();
  if (local_38 < 0) {
    sVar2 = vmb_get_len((char *)0x36e27b);
    local_38 = local_38 + (int)sVar2 + 1;
  }
  if (local_3c < 0) {
    sVar2 = vmb_get_len((char *)0x36e29f);
    local_3c = local_3c + (int)sVar2 + 1;
  }
  local_38 = local_38 + -1;
  local_3c = local_3c + -1;
  if (-1 < local_38) {
    uVar3 = (ulong)local_38;
    sVar2 = vmb_get_len((char *)0x36e2e3);
    if ((uVar3 < sVar2) && (-1 < local_3c)) {
      uVar3 = (ulong)local_3c;
      sVar2 = vmb_get_len((char *)0x36e30b);
      if ((uVar3 < sVar2) && (local_38 <= local_3c)) {
        remove_range(in_RDI,in_RSI,in_RDX,(int)((ulong)in_RCX >> 0x20),(int)in_RCX);
        return 1;
      }
    }
  }
  err_throw(0);
}

Assistant:

int CVmObjList::getp_remove_range(VMG_ vm_val_t *retval,
                                  const vm_val_t *self_val,
                                  const char *lst, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(2);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* retrieve the starting and ending index values */
    int start_idx = CVmBif::pop_int_val(vmg0_);
    int end_idx = CVmBif::pop_int_val(vmg0_);

    /* negative index values count from the end of the list */
    if (start_idx < 0)
        start_idx += vmb_get_len(lst) + 1;
    if (end_idx < 0)
        end_idx += vmb_get_len(lst) + 1;

    /* adjust to zero-based indexing */
    --start_idx;
    --end_idx;

    /* 
     *   make sure the index values are in range - both must refer to valid
     *   elements, and the ending index must be at least as high as the
     *   starting index 
     */
    if (start_idx < 0 || (size_t)start_idx >= vmb_get_len(lst)
          || end_idx < 0 || (size_t)end_idx >= vmb_get_len(lst)
          || end_idx < start_idx)
        err_throw(VMERR_INDEX_OUT_OF_RANGE);

    /* remove the specified elements */
    remove_range(vmg_ retval, self_val, lst, start_idx,
                 end_idx - start_idx + 1);

    /* handled */
    return TRUE;
}